

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFunctionalTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::ShaderLibraryTest::init(ShaderLibraryTest *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  int i;
  long lVar2;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> children;
  ShaderLibrary shaderLibrary;
  string fileName;
  _Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> local_60;
  ShaderLibrary local_48;
  char *local_30 [4];
  
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::ShaderLibrary::ShaderLibrary
            (&local_48,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar1->m_renderCtx,pCVar1->m_contextInfo);
  std::__cxx11::string::string((string *)local_30,(string *)&this->m_filename);
  deqp::gls::ShaderLibrary::loadShaderFile
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&local_60,&local_48,
             local_30[0]);
  for (lVar2 = 0;
      lVar2 < (int)((ulong)((long)local_60._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_60._M_impl.super__Vector_impl_data._M_start) >> 3);
      lVar2 = lVar2 + 1) {
    tcu::TestNode::addChild
              ((TestNode *)this,local_60._M_impl.super__Vector_impl_data._M_start[lVar2]);
  }
  std::_Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~_Vector_base(&local_60);
  std::__cxx11::string::~string((string *)local_30);
  deqp::gls::ShaderLibrary::~ShaderLibrary(&local_48);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		gls::ShaderLibrary			shaderLibrary(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo());
		std::string					fileName	= m_filename;
		std::vector<tcu::TestNode*>	children	= shaderLibrary.loadShaderFile(fileName.c_str());

		for (int i = 0; i < (int)children.size(); i++)
			addChild(children[i]);
	}